

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HArray.hpp
# Opt level: O0

Value<char> * __thiscall
Qentem::HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
          (HArray<Qentem::String<char>,_Qentem::Value<char>_> *this,Char_T *key,SizeT length)

{
  SizeT SVar1;
  SizeT SVar2;
  String<char> local_48;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *local_38;
  HItem *item;
  SizeT *index;
  SizeT hash;
  SizeT length_local;
  Char_T *key_local;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> *this_local;
  
  index._4_4_ = length;
  _hash = key;
  key_local = (Char_T *)this;
  SVar1 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
          ::Size(&this->
                  super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                );
  SVar2 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
          ::Capacity(&this->
                      super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                    );
  if (SVar1 == SVar2) {
    HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
    expand(&this->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
          );
  }
  index._0_4_ = StringUtils::Hash<char>(_hash,index._4_4_);
  local_38 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ::find(&this->
                     super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                    ,(SizeT **)&item,_hash,index._4_4_,(SizeT)index);
  if (local_38 == (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)0x0) {
    String<char>::String(&local_48,_hash,index._4_4_);
    local_38 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               ::insert(&this->
                         super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                        ,(SizeT *)item,&local_48,(SizeT)index);
    String<char>::~String(&local_48);
    Memory::Initialize<Qentem::Value<char>>(&local_38->Value);
  }
  this_local = (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_38->Value;
  return (Value<char> *)this_local;
}

Assistant:

Value_T &Get(const Char_T *key, const SizeT length) {
        if (Size() == Capacity()) {
            expand();
        }

        const SizeT hash = StringUtils::Hash(key, length);
        SizeT      *index;
        HItem      *item = find(index, key, length, hash);

        if (item != nullptr) {
            return item->Value;
        }

        item = insert(index, Key_T{key, length}, hash);
        Memory::Initialize(&(item->Value));

        return item->Value;
    }